

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorBG.cpp
# Opt level: O0

AlphaVector * __thiscall
AlphaVectorBG::BeliefBackupExhaustiveStoreAll
          (AlphaVectorBG *this,JointBeliefInterface *b,Index a,GaoVectorSet *G,
          ValueFunctionPOMDPDiscrete *V)

{
  int iVar1;
  size_t sVar2;
  reference piVar3;
  LIndex i;
  const_reference ppmVar4;
  reference pdVar5;
  Index in_ECX;
  long in_RSI;
  AlphaVectorBG *in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint s_1;
  double x;
  BGPolicyIndex betaMaxI;
  uint s;
  uint o_1;
  int k;
  VectorSet g_baBeta;
  bool round;
  Index a1;
  JointPolicyPureVector jpol;
  uint a1_1;
  uint o;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  bestG_oa1;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  mask;
  double gamma;
  uint nrS;
  uint nrO;
  uint nrA;
  AlphaVector *newVector;
  Index in_stack_fffffffffffffd48;
  Index in_stack_fffffffffffffd4c;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffd50;
  double v;
  undefined4 in_stack_fffffffffffffd60;
  Index in_stack_fffffffffffffd64;
  size_t in_stack_fffffffffffffd68;
  AlphaVector *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffd80;
  I_PtPDpure_constPtr *in_stack_fffffffffffffd88;
  JointPolicyPureVector *in_stack_fffffffffffffd90;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffd98;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffda8;
  VectorSet *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  AlphaVectorBG *this_00;
  int local_1e8;
  int local_1ac;
  int local_1a8;
  bool local_171;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> local_168 [12];
  uint local_9c;
  int local_98;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_60;
  double local_48;
  int local_3c;
  int local_38;
  uint local_34;
  Index local_1c;
  
  this_00 = in_RDI;
  local_1c = in_ECX;
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  sVar2 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x92bbb0);
  local_34 = (uint)sVar2;
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  sVar2 = PlanningUnitMADPDiscrete::GetNrJointObservations((PlanningUnitMADPDiscrete *)0x92bbd6);
  local_38 = (int)sVar2;
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  sVar2 = PlanningUnitMADPDiscrete::GetNrStates
                    (&in_stack_fffffffffffffd50->super_PlanningUnitMADPDiscrete);
  local_3c = (int)sVar2;
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  local_48 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x92bc22);
  GetMask(this_00,(ValueFunctionPOMDPDiscrete *)in_RDI);
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::matrix((matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
            *)in_stack_fffffffffffffd80,
           CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
           (size_type)in_stack_fffffffffffffd70);
  for (local_98 = 0; local_98 != local_38; local_98 = local_98 + 1) {
    for (local_9c = 0; local_9c != local_34; local_9c = local_9c + 1) {
      boost::
      multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
      ::operator[]((multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                    *)in_stack_fffffffffffffd98,(index)in_stack_fffffffffffffd90);
      boost::detail::multi_array::
      const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
      ::operator[]((const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
                    *)in_stack_fffffffffffffd80,
                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::operator[](&local_60,(ulong)local_9c);
      iVar1 = BeliefValue::GetMaximizingVectorIndex
                        ((BeliefInterface *)
                         CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      piVar3 = boost::numeric::ublas::
               matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
               ::operator()((matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd50,
                            CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0x92bd6d);
      *piVar3 = iVar1;
      boost::detail::multi_array::
      const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
      ::~const_sub_array((const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
                          *)0x92bd95);
    }
  }
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::
  shared_ptr<BayesianGameIdenticalPayoff>(local_168,in_RSI + 8);
  JointPolicyPureVector::JointPolicyPureVector(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x92be60);
  local_171 = false;
  boost::shared_ptr<BayesianGameIdenticalPayoff>::operator->
            ((shared_ptr<BayesianGameIdenticalPayoff> *)(in_RSI + 8));
  i = BayesianGameBase::GetNrJointPolicies((BayesianGameBase *)0x92be90);
  Globals::CastLIndexToIndex(i);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(in_stack_fffffffffffffd80,CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
           (size_type)in_stack_fffffffffffffd70);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::clear((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  while (((local_171 ^ 0xffU) & 1) != 0) {
    for (local_1a8 = 0; local_1a8 != local_38; local_1a8 = local_1a8 + 1) {
      for (local_1ac = 0; local_1ac != local_3c; local_1ac = local_1ac + 1) {
        JointPolicyPureVector::GetJointActionIndex
                  ((JointPolicyPureVector *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
        piVar3 = boost::numeric::ublas::
                 matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                 ::operator()((matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffd50,
                              CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0x92bf86
                             );
        if (*piVar3 != -1) {
          boost::
          multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
          ::operator[]((multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                        *)in_stack_fffffffffffffd98,(index)in_stack_fffffffffffffd90);
          ppmVar4 = boost::detail::multi_array::
                    const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
                    ::operator[]((const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
                                  *)in_stack_fffffffffffffd80,
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          in_stack_fffffffffffffd98 = *ppmVar4;
          boost::numeric::ublas::
          matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
          ::operator()((matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                        *)in_stack_fffffffffffffd50,
                       CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0x92c004);
          in_stack_fffffffffffffd90 =
               (JointPolicyPureVector *)
               boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffd50,
                            CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0x92c026);
          in_stack_fffffffffffffd80 =
               (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)(in_stack_fffffffffffffd90->super_JointPolicyDiscretePure).
                  super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy;
          pdVar5 = boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffd50,
                                CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                0x92c05a);
          *pdVar5 = (double)in_stack_fffffffffffffd80 + *pdVar5;
          boost::detail::multi_array::
          const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
          ::~const_sub_array((const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
                              *)0x92c081);
        }
      }
    }
    local_171 = JointPolicyPureVector::operator++((JointPolicyPureVector *)0x92c13e);
    in_stack_fffffffffffffd7c = CONCAT13(local_171,(int3)in_stack_fffffffffffffd7c);
  }
  iVar1 = BeliefValue::GetMaximizingVectorIndex
                    ((BeliefInterface *)in_stack_fffffffffffffd80,
                     (VectorSet *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  AlphaVector::AlphaVector(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  AlphaVector::SetAction((AlphaVector *)in_RDI,local_1c);
  AlphaVector::SetBetaI(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  for (local_1e8 = 0; local_1e8 != local_3c; local_1e8 = local_1e8 + 1) {
    AlphaVectorPlanning::GetPU
              ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48))
    ;
    dVar6 = PlanningUnitDecPOMDPDiscrete::GetReward
                      (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48
                      );
    v = local_48;
    in_stack_fffffffffffffd64 = Globals::CastLIndexToIndex((long)iVar1);
    in_stack_fffffffffffffd50 =
         (PlanningUnitDecPOMDPDiscrete *)
         boost::numeric::ublas::
         matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
         ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       *)in_stack_fffffffffffffd50,
                      CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0x92c276);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = v;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar6;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (in_stack_fffffffffffffd50->super_PlanningUnitMADPDiscrete).super_PlanningUnit.
                   _vptr_PlanningUnit;
    vfmadd213sd_fma(auVar7,auVar8,auVar9);
    AlphaVector::SetValue
              ((AlphaVector *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),v,
               (Index)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  }
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)in_stack_fffffffffffffd50);
  JointPolicyPureVector::~JointPolicyPureVector((JointPolicyPureVector *)in_stack_fffffffffffffd50);
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::~matrix((matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
             *)in_stack_fffffffffffffd50);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  return (AlphaVector *)this_00;
}

Assistant:

AlphaVector
AlphaVectorBG::BeliefBackupExhaustiveStoreAll(const JointBeliefInterface &b,
                                              Index a,
                                              const GaoVectorSet &G,
                                              const 
                                              ValueFunctionPOMDPDiscrete &V)
    const
{
    // Equation numbers refer to PWLC_Dec-POMDPs_b.ps of Nov 7

    unsigned int nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates();
    double gamma=GetPU()->GetDiscount();

    // the mask selects which vectors to consider:
    // mask[jaI][vI] is true <-> vector vI specifies action jaI
    vector<vector<bool> > mask=GetMask(V);

    // given a particular \beta
    //  for all o,   g*_bao\beta = arg max_g^va'_ao \sum_s g^va'_ao(s) * b(s)
    //
    // i.e., we select the g^va'_ao from a set consistent with \beta
    //  (which means that \beta(o) = a') that maximizes the current belief.
    //
    // In this code, however, we do something slightly different namely:
    //
    //  for all o, forall a' 
    //      g*_baoa' =  arg max_g^va'_ao \sum_s g^va'_ao(s) * b(s)
    //
    // I.e., we select the maximizing vector for each possible a'.
    // we store this in bestG_oa1[o][a'].
    boost::numeric::ublas::matrix<int> bestG_oa1(nrO,nrA);

    // (14)
    for(unsigned int o=0;o!=nrO;o++)
        for(unsigned int a1=0;a1!=nrA;++a1)
            bestG_oa1(o,a1)=BeliefValue::GetMaximizingVectorIndex(b,*G[a][o],
                                                                  mask[a1]);

    // now we create a jpol for the induced Bayesian game
    // (i.e. \beta mentioned above, is the policy for a Bayesian game)
    // and use that to combine the bestG_oa1 to g_a-vectors:
    //  g_ba\beta = \sum_o bestG_oa1[o][ \beta(o) ]
    JointPolicyPureVector jpol(_m_bgip);
    Index a1;
    bool round=false;

    VectorSet g_baBeta(CastLIndexToIndex(_m_bgip->GetNrJointPolicies()),nrS);
    g_baBeta.clear();
    int k=-1;

    // (16)
    while (!round) // i.e. forall \beta
    {
        k++;
        for(unsigned int o=0;o!=nrO;o++)
            for(unsigned int s=0;s!=nrS;++s)
            {
                a1=jpol.GetJointActionIndex(o);
                /* following code implements:
                 * VectorSet V=*G[a][o];
                 * int i=bestG_oa1(o,a1);
                 * g_baBeta(k,s)+=V(i,s); // +=V[i][s]; */
                 if(bestG_oa1(o,a1)!=-1)
                     g_baBeta(k,s)+=(*G[a][o])(bestG_oa1(o,a1),s);
            }
        round = ++(jpol);
    }

    AlphaVector::BGPolicyIndex betaMaxI=
        BeliefValue::GetMaximizingVectorIndex(b,g_baBeta);

    double x;
    // create the aplha-vector for b (i.e. add immediate reward)
    AlphaVector newVector(nrS);
    newVector.SetAction(a);
    newVector.SetBetaI(betaMaxI);
    for(unsigned int s=0;s!=nrS;s++)
    {
        // (19)
        x=GetPU()->GetReward(s,a)+gamma*g_baBeta(CastLIndexToIndex(betaMaxI),s);
        newVector.SetValue(x,s);
    }

    return(newVector);
}